

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile.cc
# Opt level: O2

void __thiscall brown::Tile::drawline(Tile *this,float x0,float y0,float x1,float y1,uint32_t col)

{
  uintptr_t uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  
  fVar6 = 0.0;
  if (0.0 <= x0) {
    fVar6 = (float)this->x;
    if (fVar6 < x0) {
      if (fVar6 < x1) {
        return;
      }
      goto LAB_00105816;
    }
  }
  else {
    if (x1 < 0.0) {
      return;
    }
LAB_00105816:
    y0 = y0 + ((y1 - y0) * (fVar6 - x0)) / (x1 - x0);
    x0 = fVar6;
  }
  fVar6 = 0.0;
  if (0.0 <= y0) {
    fVar6 = (float)this->y;
    if (fVar6 < y0) {
      if (fVar6 < y1) {
        return;
      }
      goto LAB_00105865;
    }
  }
  else {
    if (y1 < 0.0) {
      return;
    }
LAB_00105865:
    x0 = x0 + ((x1 - x0) * (fVar6 - y0)) / (y1 - y0);
    y0 = fVar6;
  }
  if (0.0 <= x1) {
    fVar6 = (float)this->x;
    if (fVar6 < x1) goto LAB_001058a2;
  }
  else {
    fVar6 = 0.0;
LAB_001058a2:
    y1 = y1 + ((y1 - y0) * (fVar6 - x1)) / (x1 - x0);
    x1 = fVar6;
  }
  if (0.0 <= y1) {
    fVar6 = (float)this->y;
    if (y1 <= fVar6) goto LAB_001058fc;
  }
  else {
    fVar6 = 0.0;
  }
  x1 = x1 + ((x1 - x0) * (fVar6 - y1)) / (y1 - y0);
  y1 = fVar6;
LAB_001058fc:
  fVar6 = ABS(x1 - x0);
  fVar5 = ABS(y1 - y0);
  if (fVar6 <= fVar5) {
    fVar6 = fVar5;
  }
  uVar2 = (uint)fVar6;
  if ((uVar2 & 0x7fffffff) != 0) {
    fVar6 = (float)(int)uVar2;
    iVar3 = (int)(x0 * 65536.0);
    iVar4 = (int)(y0 * 65536.0);
    uVar1 = this->f;
    for (; 0 < (int)uVar2; uVar2 = uVar2 - 1) {
      if (((uint)(iVar3 >> 0x10) < (uint)this->x) && ((uint)(iVar4 >> 0x10) < (uint)this->y)) {
        *(uint32_t *)(uVar1 + (long)((iVar4 >> 0x10) * this->p + (iVar3 >> 0x10) * 4)) = col;
      }
      iVar3 = iVar3 + (int)((x1 - x0) * (65536.0 / fVar6));
      iVar4 = iVar4 + (int)((y1 - y0) * (65536.0 / fVar6));
    }
  }
  return;
}

Assistant:

void Tile::drawline (float x0, float y0, float x1, float y1, std::uint32_t col)
{
    float f;
    int i, x, y, ipx[2], ipy[2];

    if (x0 <   0.f) { if (x1 <   0.f) return; y0 = (         0.f-x0)*(y1-y0)/(x1-x0)+y0; x0 =          0.f; } else
    if (x0 > this->x) { if (x1 > this->x) return; y0 = ((float)this->x-x0)*(y1-y0)/(x1-x0)+y0; x0 = (float)this->x; }
    if (y0 <   0.f) { if (y1 <   0.f) return; x0 = (         0.f-y0)*(x1-x0)/(y1-y0)+x0; y0 =          0.f; } else
    if (y0 > this->y) { if (y1 > this->y) return; x0 = ((float)this->y-y0)*(x1-x0)/(y1-y0)+x0; y0 = (float)this->y; }
    if (x1 <   0.f) {                         y1 = (         0.f-x1)*(y1-y0)/(x1-x0)+y1; x1 =          0.f; } else
    if (x1 > this->x) {                         y1 = ((float)this->x-x1)*(y1-y0)/(x1-x0)+y1; x1 = (float)this->x; }
    if (y1 <   0.f) {                         x1 = (         0.f-y1)*(x1-x0)/(y1-y0)+x1; y1 =          0.f; } else
    if (y1 > this->y) {                         x1 = ((float)this->y-y1)*(x1-x0)/(y1-y0)+x1; y1 = (float)this->y; }

    x1 -= x0; y1 -= y0;
    i = (int)max(fabs(x1),fabs(y1)); if (!(i&0x7fffffff)) return;/*FUK:32-bit!*/
    f = 65536.f/(float)i;
    ipx[0] = (int)(x0*65536.0); ipx[1] = (int)(x1*f);
    ipy[0] = (int)(y0*65536.0); ipy[1] = (int)(y1*f);
    for(;i>0;i--)
    {
        x = (ipx[0]>>16); y = (ipy[0]>>16);
        if (((unsigned)x < (unsigned)this->x) && ((unsigned)y < (unsigned)this->y))
            *(std::uint32_t *)(this->p*y + (x<<2) + this->f) = col;
        ipx[0] += ipx[1]; ipy[0] += ipy[1];
    }
}